

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::generateShaders
          (SamplerBindingRenderCase *this)

{
  ShaderType SVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  const_reference pvVar5;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  ProgramSources *pPVar6;
  GLint local_5f8;
  bool local_5f1;
  string local_5b0;
  string local_590;
  string local_570;
  ShaderSource local_550;
  string local_528;
  string local_508;
  string local_4e8;
  ShaderSource local_4c8;
  ProgramSources local_4a0;
  string local_3d0;
  string local_3b0;
  int local_38c;
  undefined1 local_388 [4];
  int bindNdx;
  int local_364;
  GLint local_360;
  int declNdx;
  int numDeclarations;
  bool arrayInstance;
  string samplerType;
  string local_330 [8];
  string texCoordType;
  undefined1 local_300 [8];
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  SamplerBindingRenderCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  DVar2 = getSamplerTexCoordType(this);
  pcVar3 = glu::getDataTypeName(DVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,pcVar3,(allocator<char> *)(samplerType.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(samplerType.field_2._M_local_buf + 0xf));
  DVar2 = glu::getDataTypeFromGLType(this->m_samplerType);
  pcVar3 = glu::getDataTypeName(DVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numDeclarations,pcVar3,(allocator<char> *)((long)&declNdx + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&declNdx + 3));
  local_5f1 = true;
  if ((this->super_LayoutBindingRenderCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    local_5f1 = (this->super_LayoutBindingRenderCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  declNdx._2_1_ = -local_5f1 & 1;
  if (declNdx._2_1_ == 0) {
    local_5f8 = (this->super_LayoutBindingRenderCase).m_numBindings;
  }
  else {
    local_5f8 = 1;
  }
  local_360 = local_5f8;
  for (local_364 = 0; local_364 < local_360; local_364 = local_364 + 1) {
    poVar4 = std::operator<<((ostream *)&shaderBody.field_0x170,"layout(binding = ");
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingRenderCase).m_bindings,(long)local_364);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
    poVar4 = std::operator<<(poVar4,") uniform highp ");
    poVar4 = std::operator<<(poVar4,(string *)&numDeclarations);
    poVar4 = std::operator<<(poVar4," ");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName((string *)local_388,&(this->super_LayoutBindingRenderCase).m_uniformName,
                     local_364);
    }
    else {
      getUniformName((string *)local_388,&(this->super_LayoutBindingRenderCase).m_uniformName,
                     local_364,(this->super_LayoutBindingRenderCase).m_numBindings);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_388);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_388);
  }
  for (local_38c = 0; local_38c < (this->super_LayoutBindingRenderCase).m_numBindings;
      local_38c = local_38c + 1) {
    poVar4 = std::operator<<((ostream *)local_300,"\t");
    pcVar3 = "else if";
    if (local_38c == 0) {
      pcVar3 = "if";
    }
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," (u_arrayNdx == ");
    de::toString<int>(&local_3b0,&local_38c);
    poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
    poVar4 = std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<(poVar4,"\t{\n");
    poVar4 = std::operator<<(poVar4,"\t\tcolor = texture(");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName(&local_3d0,&(this->super_LayoutBindingRenderCase).m_uniformName,local_38c);
    }
    else {
      getUniformName(&local_3d0,&(this->super_LayoutBindingRenderCase).m_uniformName,0,local_38c);
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_3d0);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,local_330);
    poVar4 = std::operator<<(poVar4,"(0.5));\n");
    std::operator<<(poVar4,"\t}\n");
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  poVar4 = std::operator<<((ostream *)local_300,"\telse\n");
  poVar4 = std::operator<<(poVar4,"\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar4,"\t}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext
                        ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_4a0);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateVertexShader(&local_4e8,SVar1,&local_508,&local_528);
  glu::VertexSource::VertexSource((VertexSource *)&local_4c8,&local_4e8);
  pPVar6 = glu::ProgramSources::operator<<(&local_4a0,&local_4c8);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateFragmentShader(&local_570,SVar1,&local_590,&local_5b0);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_550,&local_570);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_550);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar6);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  glu::VertexSource::~VertexSource((VertexSource *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  glu::ProgramSources::~ProgramSources(&local_4a0);
  std::__cxx11::string::~string((string *)&numDeclarations);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  return this_00;
}

Assistant:

glu::ShaderProgram* SamplerBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getSamplerTexCoordType());
	const std::string		samplerType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_samplerType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY) ? true : false;
	const int				numDeclarations =  arrayInstance ? 1 : m_numBindings;

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(binding = " << m_bindings[declNdx] << ") uniform highp " << samplerType << " "
			<< (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = texture(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0.5));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}